

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5ExprNew(Fts5Config *pConfig,int iCol,char *zExpr,Fts5Expr **ppNew,char **pzErr)

{
  char cVar1;
  Fts5Parse *pFVar2;
  undefined8 uVar3;
  Fts5Config *pFVar4;
  char **ppcVar5;
  byte bVar6;
  int iVar7;
  fts5yyParser *fts5yypParser_00;
  Fts5ExprPhrase *pFVar8;
  Fts5ExprNode *pFVar9;
  char *pcVar10;
  Fts5Colset *pFVar11;
  Fts5Expr *pFVar12;
  Fts5ExprNode *pFVar13;
  long lVar14;
  byte *pbVar15;
  Fts5ExprNode *pFVar16;
  Fts5Colset *pFVar17;
  ulong uVar18;
  Fts5ExprNode *pFVar19;
  fts5YYMINORTYPE *fts5yypminor;
  ulong uVar20;
  Fts5Colset *__s1;
  byte bVar21;
  Fts5ExprNearset *pNear;
  ulong uVar22;
  uint uVar23;
  fts5yyParser *fts5yypParser;
  fts5yyStackEntry *pfVar24;
  fts5yyStackEntry *pfVar25;
  fts5yyStackEntry *pfVar26;
  ulong uStack_c0;
  uint local_ac;
  ulong local_a8;
  Fts5Parse local_a0;
  fts5yyStackEntry *local_78;
  int local_6c;
  Fts5Colset *local_68;
  Fts5Expr **local_60;
  Fts5Config *local_58;
  char **local_50;
  Fts5ExprNode *local_48;
  Fts5Colset *local_40;
  int local_38;
  
  *ppNew = (Fts5Expr *)0x0;
  *pzErr = (char *)0x0;
  local_a0.apPhrase = (Fts5ExprPhrase **)0x0;
  local_a0.pExpr = (Fts5ExprNode *)0x0;
  local_a0.zErr = (char *)0x0;
  local_a0.rc = 0;
  local_a0.nPhrase = 0;
  local_68 = (Fts5Colset *)zExpr;
  local_60 = ppNew;
  fts5yypParser_00 = (fts5yyParser *)sqlite3_malloc64(0x978);
  if (fts5yypParser_00 == (fts5yyParser *)0x0) {
    return 7;
  }
  local_78 = fts5yypParser_00->fts5yystack;
  fts5yypParser_00->fts5yytos = local_78;
  fts5yypParser_00->fts5yystack[0].stateno = '\0';
  fts5yypParser_00->fts5yystack[0].major = '\0';
  fts5yypParser_00->fts5yystackEnd = fts5yypParser_00->fts5yystack + 99;
  pFVar11 = local_68;
  __s1 = local_68;
  local_50 = pzErr;
  local_58 = pConfig;
  local_6c = iCol;
  local_a0.pConfig = pConfig;
  pfVar26 = local_78;
LAB_0018d72c:
  do {
    bVar6 = (byte)__s1->nCol;
    if (bVar6 - 9 < 2) goto switchD_0018d747_caseD_20;
    switch(bVar6) {
    case 0x20:
      goto switchD_0018d747_caseD_20;
    case 0x21:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
switchD_0018d747_caseD_21:
      if ((-1 < (char)bVar6) && ((&DAT_001c10e0)[bVar6] == '\0')) {
        sqlite3Fts5ParseError(&local_a0,"fts5: syntax error near \"%.1s\"",__s1);
        goto LAB_0018de4c;
      }
      uVar20 = 1;
      while ((lVar14 = (long)*(char *)((long)__s1->aiCol + (uVar20 - 4)), lVar14 < 0 ||
             ((&DAT_001c10e0)[lVar14] != '\0'))) {
        uVar20 = uVar20 + 1;
      }
      if ((int)uVar20 == 2) {
        local_ac = (uint)((short)__s1->nCol != 0x524f) * 8 + 1;
        uStack_c0 = 2;
      }
      else {
        if ((int)uVar20 != 3) {
          uVar18 = uVar20 & 0xffffffff;
LAB_0018d912:
          uStack_c0._0_4_ = 9;
          break;
        }
        iVar7 = bcmp(__s1,"NOT",3);
        local_ac = 9;
        if (iVar7 == 0) {
          local_ac = 3;
        }
        iVar7 = bcmp(__s1,"AND",3);
        if (iVar7 == 0) {
          local_ac = 2;
        }
        uStack_c0 = 3;
      }
      goto LAB_0018d919;
    case 0x22:
      pFVar17 = __s1;
      do {
        cVar1 = *(char *)((long)&pFVar17->nCol + 1);
        if (cVar1 == '\"') {
          if (*(char *)((long)&pFVar17->nCol + 2) != '\"') {
            uVar18 = (long)pFVar17 + (2 - (long)pFVar11);
            uVar20 = uVar18;
            goto LAB_0018d912;
          }
          pFVar17 = (Fts5Colset *)((long)&pFVar17->nCol + 2);
        }
        else {
          pFVar17 = (Fts5Colset *)((long)&pFVar17->nCol + 1);
        }
      } while (cVar1 != '\0');
      sqlite3Fts5ParseError(&local_a0,"unterminated string");
LAB_0018de4c:
      local_ac = 0;
      local_a8 = 1;
      goto LAB_0018d929;
    case 0x28:
      uVar18 = 1;
      uVar20 = 1;
      uStack_c0._0_4_ = 10;
      break;
    case 0x29:
      uVar18 = 1;
      uVar20 = 1;
      uStack_c0._0_4_ = 0xb;
      break;
    case 0x2a:
      uVar18 = 1;
      uVar20 = 1;
      uStack_c0._0_4_ = 0xf;
      break;
    case 0x2b:
      uVar18 = 1;
      uVar20 = 1;
      uStack_c0._0_4_ = 0xe;
      break;
    case 0x2c:
      uVar18 = 1;
      uVar20 = 1;
      uStack_c0._0_4_ = 0xd;
      break;
    case 0x2d:
      uVar18 = 1;
      uVar20 = 1;
      uStack_c0._0_4_ = 6;
      break;
    default:
      if (bVar6 != 0xd) {
        if (bVar6 == 0) {
          local_ac = 0;
          uStack_c0 = 1;
          uVar20 = 1;
          goto LAB_0018d919;
        }
        if (bVar6 == 0x3a) {
          uVar18 = 1;
          uVar20 = 1;
          uStack_c0._0_4_ = 5;
        }
        else if (bVar6 == 0x5e) {
          uVar18 = 1;
          uVar20 = 1;
          uStack_c0._0_4_ = 0xc;
        }
        else if (bVar6 == 0x7b) {
          uVar18 = 1;
          uVar20 = 1;
          uStack_c0._0_4_ = 7;
        }
        else {
          if (bVar6 != 0x7d) goto switchD_0018d747_caseD_21;
          uVar18 = 1;
          uVar20 = 1;
          uStack_c0._0_4_ = 8;
        }
        break;
      }
      goto switchD_0018d747_caseD_20;
    }
    local_ac = (uint)uStack_c0;
    uStack_c0 = uVar18;
LAB_0018d919:
    local_68 = (Fts5Colset *)((long)__s1->aiCol + (long)(int)uVar20 + -4);
    local_a8 = uStack_c0;
LAB_0018d929:
    fts5yypParser_00->pParse = &local_a0;
    pfVar25 = fts5yypParser_00->fts5yytos;
    bVar6 = pfVar25->stateno;
    do {
      bVar21 = (byte)local_ac;
      if (bVar6 < 0x23) {
        lVar14 = (ulong)local_ac +
                 (ulong)",,,,,,3M+\f\x0eSR\x0e\x17\x17\x1f\x1fGJNQV[\x0655<@D5W\\5]"[bVar6];
        if (((uint)lVar14 < 0x79) &&
           ("\x10\x11\x12\x13\x14\x16\x16\x18\x18\x11\x12\x13\x14\a\x16\t\x18\x11\x12\x13\x14\t\x16\t\x18\r\x11\x12\x13\x14\x1a\x16\x18\x18\x11\x12\x13\x14\x0f\x16\t\x18\x11\x12\x13\x14\x1a\x16\x15\x18\x06\a\t\t\n\f\f\x06\a\x15\t\x18\x19\f\x12\x05\x14\x0e\x16\x05\x18\x03\x01\x02\x03\x01\x02\x03"
            [lVar14] == bVar21)) {
          pbVar15 = "Q\x14`\x06\x1ccb\x1a\x1a\x12`\x06\x1c\x11b8\x1a\x13`\x06\x1c\x0eb\x0e\x1a\x1f\\`\x06\x1clb\x19\x1a\x15`\x06\x1cNb:\x1a\x1d`\x06\x1ckb\x16\x1a\x18\x10\f\v\x01\r\r\x18\x10\x17\v!\"\ra\b\x1b b\a\x1a\x03\x04\x05\x03\x04\x05\x03S\x04\x05\x03?\x05\x03>\f\x02V\r\t\x1e\n\n69KNN59\x0fRRG"
                    + lVar14;
        }
        else {
          pbVar15 = "PPPPPP_PPiPnnPnnPPPPP[PPPedPPZgPPhP" + bVar6;
        }
        bVar6 = *pbVar15;
      }
      if (bVar6 < 0x53) {
        if (bVar6 < 0x50) {
          fts5yypParser_00->fts5yytos = pfVar25 + 1;
          if (fts5yypParser_00->fts5yystackEnd < pfVar25 + 1) {
            fts5yypParser_00->fts5yytos = pfVar25;
            fts5yyStackOverflow(fts5yypParser_00);
          }
          else {
            if (0x22 < bVar6) {
              bVar6 = bVar6 + 0x1f;
            }
            pfVar25[1].stateno = bVar6;
            pfVar25[1].major = bVar21;
            pfVar25[1].minor.fts5yy11 = __s1;
            pfVar25[1].minor.fts5yy0.n = (int)local_a8;
          }
        }
        else if (bVar6 == 0x51) {
          fts5yypParser_00->fts5yytos = pfVar25 + -1;
        }
        else {
          pFVar2 = fts5yypParser_00->pParse;
          local_40 = __s1;
          local_38 = (int)local_a8;
          sqlite3Fts5ParseError(pFVar2,"fts5: syntax error near \"%.*s\"",local_a8,__s1);
          fts5yypParser_00->pParse = pFVar2;
          fts5yy_destructor((fts5yyParser *)(ulong)bVar21,(uchar)&local_40,fts5yypminor);
        }
        break;
      }
      uVar23 = bVar6 - 0x53;
      uVar20 = (ulong)uVar23;
      if (0x1b < uVar23) goto switchD_0018d9ae_caseD_c;
      pFVar2 = fts5yypParser_00->pParse;
      switch(uVar20) {
      case 0:
        pFVar2->pExpr = (Fts5ExprNode *)(pfVar25->minor).fts5yy0.p;
        break;
      case 1:
        pFVar8 = (Fts5ExprPhrase *)sqlite3Fts5ParseColsetInvert(pFVar2,pfVar25[-1].minor.fts5yy11);
        goto LAB_0018db8a;
      default:
        pFVar13 = (Fts5ExprNode *)pfVar25[-1].minor.fts5yy0.p;
        goto LAB_0018dc38;
      case 3:
      case 6:
        pFVar13 = (Fts5ExprNode *)
                  sqlite3Fts5ParseColset(pFVar2,(Fts5Colset *)0x0,&(pfVar25->minor).fts5yy0);
        goto LAB_0018daff;
      case 4:
        pFVar11 = sqlite3Fts5ParseColset(pFVar2,(Fts5Colset *)0x0,&(pfVar25->minor).fts5yy0);
        pfVar25[-1].minor.fts5yy11 = pFVar11;
        pFVar8 = (Fts5ExprPhrase *)sqlite3Fts5ParseColsetInvert(pFVar2,pFVar11);
        goto LAB_0018dc87;
      case 5:
        pFVar8 = (Fts5ExprPhrase *)
                 sqlite3Fts5ParseColset(pFVar2,pfVar25[-1].minor.fts5yy11,&(pfVar25->minor).fts5yy0)
        ;
        goto LAB_0018dc87;
      case 7:
        pFVar13 = pfVar25[-2].minor.fts5yy24;
        pFVar16 = (pfVar25->minor).fts5yy24;
        iVar7 = 2;
        goto LAB_0018dc2c;
      case 8:
        pFVar13 = pfVar25[-2].minor.fts5yy24;
        pFVar16 = (pfVar25->minor).fts5yy24;
        iVar7 = 1;
        goto LAB_0018dc2c;
      case 9:
        pFVar13 = pfVar25[-2].minor.fts5yy24;
        pFVar16 = (pfVar25->minor).fts5yy24;
        iVar7 = 3;
LAB_0018dc2c:
        pFVar13 = sqlite3Fts5ParseNode(pFVar2,iVar7,pFVar13,pFVar16,(Fts5ExprNearset *)0x0);
LAB_0018dc38:
        pfVar25[-2].minor.fts5yy0.p = (char *)pFVar13;
        break;
      case 10:
        sqlite3Fts5ParseSetColset(pFVar2,pfVar25[-1].minor.fts5yy24,pfVar25[-4].minor.fts5yy11);
        pcVar10 = pfVar25[-1].minor.fts5yy0.p;
        goto LAB_0018dcab;
      case 0xc:
      case 0xd:
        break;
      case 0xe:
        pFVar13 = pfVar25[-1].minor.fts5yy24;
        pFVar16 = (pfVar25->minor).fts5yy24;
        if (pFVar2->rc == 0) {
          pFVar9 = pFVar13;
          if (pFVar13->eType == 2) {
            pFVar9 = pFVar13->apChild[(long)pFVar13->nChild + -1];
          }
          if (pFVar16->eType == 0) {
            sqlite3Fts5ParseNodeFree(pFVar16);
            pFVar2->nPhrase = pFVar2->nPhrase + -1;
          }
          else if (pFVar9->eType == 0) {
            pFVar19 = pFVar16;
            if (pFVar9 != pFVar13) {
              pFVar13->apChild[(long)pFVar13->nChild + -1] = pFVar16;
              pFVar19 = pFVar13;
            }
            uVar23 = pFVar16->pNear->nPhrase;
            lVar14 = (long)(int)(~uVar23 + pFVar2->nPhrase);
            local_48 = pFVar9;
            memmove(pFVar2->apPhrase + lVar14,pFVar2->apPhrase + lVar14 + 1,(long)(int)uVar23 << 3);
            pFVar2->nPhrase = pFVar2->nPhrase + -1;
            sqlite3Fts5ParseNodeFree(local_48);
            pFVar13 = pFVar19;
          }
          else {
            pFVar13 = sqlite3Fts5ParseNode(pFVar2,2,pFVar13,pFVar16,(Fts5ExprNearset *)0x0);
          }
        }
        else {
          sqlite3Fts5ParseNodeFree(pFVar13);
          sqlite3Fts5ParseNodeFree(pFVar16);
          pFVar13 = (Fts5ExprNode *)0x0;
        }
        pfVar25[-1].minor.fts5yy0.p = (char *)pFVar13;
        pfVar26 = local_78;
        break;
      case 0xf:
        pFVar13 = sqlite3Fts5ParseNode
                            (pFVar2,9,(Fts5ExprNode *)0x0,(Fts5ExprNode *)0x0,
                             (pfVar25->minor).fts5yy46);
        goto LAB_0018daff;
      case 0x10:
        pFVar13 = sqlite3Fts5ParseNode
                            (pFVar2,9,(Fts5ExprNode *)0x0,(Fts5ExprNode *)0x0,
                             (pfVar25->minor).fts5yy46);
        sqlite3Fts5ParseSetColset(pFVar2,pFVar13,pfVar25[-2].minor.fts5yy11);
        pfVar25[-2].minor.fts5yy24 = pFVar13;
        pfVar26 = local_78;
        break;
      case 0x11:
      case 0x14:
        pFVar13 = (Fts5ExprNode *)
                  sqlite3Fts5ParseNearset(pFVar2,(Fts5ExprNearset *)0x0,(pfVar25->minor).fts5yy53);
LAB_0018daff:
        (pfVar25->minor).fts5yy46 = (Fts5ExprNearset *)pFVar13;
        break;
      case 0x12:
        pFVar8 = (pfVar25->minor).fts5yy53;
        if (pFVar8 == (Fts5ExprPhrase *)0x0) {
          pFVar8 = (Fts5ExprPhrase *)0x0;
        }
        else if (pFVar8->nTerm != 0) {
          pFVar8->aTerm[0].bFirst = '\x01';
          pFVar8 = (pfVar25->minor).fts5yy53;
        }
        pNear = (Fts5ExprNearset *)0x0;
        goto LAB_0018dc82;
      case 0x13:
        if ((pfVar25[-4].minor.fts5yy0.n != 4) || ((pfVar25[-4].minor.fts5yy11)->nCol != 0x5241454e)
           ) {
          sqlite3Fts5ParseError(pFVar2,"fts5: syntax error near \"%.*s\"");
        }
        if (pfVar25[-2].minor.fts5yy11 != (Fts5Colset *)0x0) {
          uVar23 = pfVar25[-1].minor.fts5yy0.n;
          if (uVar23 == 0) {
            iVar7 = 10;
          }
          else {
            uVar18 = 0;
            uVar22 = 0;
            if (0 < (int)uVar23) {
              uVar22 = (ulong)uVar23;
            }
            iVar7 = 0;
            for (; uVar22 != uVar18; uVar18 = uVar18 + 1) {
              bVar6 = pfVar25[-1].minor.fts5yy0.p[uVar18];
              if (9 < (byte)(bVar6 - 0x30)) {
                sqlite3Fts5ParseError(pFVar2,"expected integer, got \"%.*s\"");
                goto LAB_0018dca7;
              }
              iVar7 = iVar7 * 10 + (uint)bVar6 + -0x30;
            }
          }
          (pfVar25[-2].minor.fts5yy11)->nCol = iVar7;
        }
LAB_0018dca7:
        pcVar10 = pfVar25[-2].minor.fts5yy0.p;
LAB_0018dcab:
        pfVar25[-4].minor.fts5yy0.p = pcVar10;
        break;
      case 0x15:
        pNear = pfVar25[-1].minor.fts5yy46;
        pFVar8 = (pfVar25->minor).fts5yy53;
LAB_0018dc82:
        pFVar8 = (Fts5ExprPhrase *)sqlite3Fts5ParseNearset(pFVar2,pNear,pFVar8);
        goto LAB_0018dc87;
      case 0x16:
      case 0x1b:
        if (pfVar25 < fts5yypParser_00->fts5yystackEnd) {
          iVar7 = (*(code *)(&DAT_001bc9b4 + *(int *)(&DAT_001bc9b4 + (ulong)(bVar6 - 0x69) * 4)))()
          ;
          return iVar7;
        }
        fts5yyStackOverflow(fts5yypParser_00);
        pfVar25 = fts5yypParser_00->fts5yytos;
        bVar6 = 0;
        goto LAB_0018dcfb;
      case 0x17:
        uVar3 = *(undefined8 *)((long)&pfVar25->minor + 8);
        pfVar25[-1].minor.fts5yy0.p = (pfVar25->minor).fts5yy0.p;
        *(undefined8 *)((long)&pfVar25[-1].minor + 8) = uVar3;
        break;
      case 0x18:
        pFVar8 = sqlite3Fts5ParseTerm
                           (pFVar2,pfVar25[-3].minor.fts5yy53,&pfVar25[-1].minor.fts5yy0,
                            (pfVar25->minor).fts5yyinit);
LAB_0018db8a:
        pfVar25[-3].minor.fts5yy53 = pFVar8;
        break;
      case 0x19:
        pFVar8 = sqlite3Fts5ParseTerm
                           (pFVar2,(Fts5ExprPhrase *)0x0,&pfVar25[-1].minor.fts5yy0,
                            (pfVar25->minor).fts5yyinit);
LAB_0018dc87:
        pfVar25[-1].minor.fts5yy53 = pFVar8;
        break;
      case 0x1a:
        (pfVar25->minor).fts5yyinit = 1;
      }
switchD_0018d9ae_caseD_c:
      bVar21 = "\x10\x14\x14\x14\x14\x15\x15\x11\x11\x11\x11\x11\x11\x13\x13\x12\x12\x16\x16\x16\x17\x17\x19\x19\x18\x18\x1a\x1a"
               [uVar20];
      pfVar24 = pfVar25 + fts5yyRuleInfoNRhs[uVar20];
      pfVar25 = pfVar24 + 1;
      bVar6 = "Q\x14`\x06\x1ccb\x1a\x1a\x12`\x06\x1c\x11b8\x1a\x13`\x06\x1c\x0eb\x0e\x1a\x1f\\`\x06\x1clb\x19\x1a\x15`\x06\x1cNb:\x1a\x1d`\x06\x1ckb\x16\x1a\x18\x10\f\v\x01\r\r\x18\x10\x17\v!\"\ra\b\x1b b\a\x1a\x03\x04\x05\x03\x04\x05\x03S\x04\x05\x03?\x05\x03>\f\x02V\r\t\x1e\n\n69KNN59\x0fRRG"
              [(long)fts5yy_reduce_ofst[pfVar24->stateno] + (ulong)bVar21];
      fts5yypParser_00->fts5yytos = pfVar25;
      pfVar25->stateno = bVar6;
      pfVar24[1].major = bVar21;
LAB_0018dcfb:
    } while (pfVar26 < pfVar25);
    pFVar4 = local_58;
    iVar7 = local_6c;
  } while ((local_ac != 0) && (pFVar11 = local_68, __s1 = local_68, local_a0.rc == 0));
  while (local_78 < fts5yypParser_00->fts5yytos) {
    fts5yy_pop_parser_stack(fts5yypParser_00);
  }
  sqlite3_free(fts5yypParser_00);
  ppcVar5 = local_50;
  if (local_a0.rc == 0 && (local_a0.pExpr != (Fts5ExprNode *)0x0 && iVar7 < pFVar4->nCol)) {
    pFVar11 = (Fts5Colset *)sqlite3Fts5MallocZero(&local_a0.rc,8);
    if (pFVar11 != (Fts5Colset *)0x0) {
      pFVar11->nCol = 1;
      pFVar11->aiCol[0] = iVar7;
      sqlite3Fts5ParseSetColset(&local_a0,local_a0.pExpr,pFVar11);
    }
  }
  if (local_a0.rc == 0) {
    pFVar12 = (Fts5Expr *)sqlite3_malloc(0x28);
    *local_60 = pFVar12;
    if (pFVar12 != (Fts5Expr *)0x0) {
      if (local_a0.pExpr == (Fts5ExprNode *)0x0) {
        pFVar13 = (Fts5ExprNode *)sqlite3Fts5MallocZero(&local_a0.rc,0x38);
        pFVar12->pRoot = pFVar13;
        if (pFVar13 != (Fts5ExprNode *)0x0) {
          pFVar13->bEof = 1;
        }
      }
      else {
        pFVar12->pRoot = local_a0.pExpr;
      }
      pFVar12->pIndex = (Fts5Index *)0x0;
      pFVar12->pConfig = pFVar4;
      pFVar12->apExprPhrase = local_a0.apPhrase;
      pFVar12->nPhrase = local_a0.nPhrase;
      local_a0.apPhrase = (Fts5ExprPhrase **)0x0;
      goto LAB_0018df5b;
    }
    local_a0.rc = 7;
  }
  sqlite3Fts5ParseNodeFree(local_a0.pExpr);
LAB_0018df5b:
  sqlite3_free(local_a0.apPhrase);
  *ppcVar5 = local_a0.zErr;
  return local_a0.rc;
switchD_0018d747_caseD_20:
  pFVar11 = (Fts5Colset *)((long)&pFVar11->nCol + 1);
  __s1 = (Fts5Colset *)((long)&__s1->nCol + 1);
  goto LAB_0018d72c;
}

Assistant:

static int sqlite3Fts5ExprNew(
  Fts5Config *pConfig,            /* FTS5 Configuration */
  int iCol,
  const char *zExpr,              /* Expression text */
  Fts5Expr **ppNew, 
  char **pzErr
){
  Fts5Parse sParse;
  Fts5Token token;
  const char *z = zExpr;
  int t;                          /* Next token type */
  void *pEngine;
  Fts5Expr *pNew;

  *ppNew = 0;
  *pzErr = 0;
  memset(&sParse, 0, sizeof(sParse));
  pEngine = sqlite3Fts5ParserAlloc(fts5ParseAlloc);
  if( pEngine==0 ){ return SQLITE_NOMEM; }
  sParse.pConfig = pConfig;

  do {
    t = fts5ExprGetToken(&sParse, &z, &token);
    sqlite3Fts5Parser(pEngine, t, token, &sParse);
  }while( sParse.rc==SQLITE_OK && t!=FTS5_EOF );
  sqlite3Fts5ParserFree(pEngine, fts5ParseFree);

  /* If the LHS of the MATCH expression was a user column, apply the
  ** implicit column-filter.  */
  if( iCol<pConfig->nCol && sParse.pExpr && sParse.rc==SQLITE_OK ){
    int n = sizeof(Fts5Colset);
    Fts5Colset *pColset = (Fts5Colset*)sqlite3Fts5MallocZero(&sParse.rc, n);
    if( pColset ){
      pColset->nCol = 1;
      pColset->aiCol[0] = iCol;
      sqlite3Fts5ParseSetColset(&sParse, sParse.pExpr, pColset);
    }
  }

  assert( sParse.rc!=SQLITE_OK || sParse.zErr==0 );
  if( sParse.rc==SQLITE_OK ){
    *ppNew = pNew = sqlite3_malloc(sizeof(Fts5Expr));
    if( pNew==0 ){
      sParse.rc = SQLITE_NOMEM;
      sqlite3Fts5ParseNodeFree(sParse.pExpr);
    }else{
      if( !sParse.pExpr ){
        const int nByte = sizeof(Fts5ExprNode);
        pNew->pRoot = (Fts5ExprNode*)sqlite3Fts5MallocZero(&sParse.rc, nByte);
        if( pNew->pRoot ){
          pNew->pRoot->bEof = 1;
        }
      }else{
        pNew->pRoot = sParse.pExpr;
      }
      pNew->pIndex = 0;
      pNew->pConfig = pConfig;
      pNew->apExprPhrase = sParse.apPhrase;
      pNew->nPhrase = sParse.nPhrase;
      sParse.apPhrase = 0;
    }
  }else{
    sqlite3Fts5ParseNodeFree(sParse.pExpr);
  }

  sqlite3_free(sParse.apPhrase);
  *pzErr = sParse.zErr;
  return sParse.rc;
}